

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

void __thiscall
google::protobuf::internal::KeyMapBase<unsigned_int>::erase_no_destroy
          (KeyMapBase<unsigned_int> *this,map_index_t b,KeyNode *node)

{
  bool bVar1;
  NodeBase *pNVar2;
  TableEntryPtr TVar3;
  ulong uVar4;
  iterator tree_it_00;
  map_index_t b_local;
  TreeIterator tree_it;
  LogMessageFatal local_28 [16];
  
  tree_it.node_ =
       (btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
        *)0x0;
  tree_it.position_ = -1;
  b_local = b;
  bVar1 = revalidate_if_necessary(this,&b_local,node,&tree_it);
  if (bVar1) {
    TVar3 = (this->super_UntypedMapBase).table_[b_local];
    if ((TVar3 == 0) || ((TVar3 & 1) != 0)) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_28,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/map.h"
                 ,0x3bc,0x1b,"TableEntryIsNonEmptyList(b)");
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_28);
    }
    pNVar2 = TableEntryToNode(TVar3);
    pNVar2 = EraseFromLinkedList(&node->super_NodeBase,pNVar2);
    TVar3 = NodeToTableEntry(pNVar2);
    (this->super_UntypedMapBase).table_[b_local] = TVar3;
  }
  else {
    tree_it_00.position_ = tree_it.position_;
    tree_it_00.node_ = tree_it.node_;
    tree_it_00._12_4_ = 0;
    UntypedMapBase::EraseFromTree(&this->super_UntypedMapBase,b_local,tree_it_00);
  }
  (this->super_UntypedMapBase).num_elements_ = (this->super_UntypedMapBase).num_elements_ - 1;
  if (b_local == (this->super_UntypedMapBase).index_of_first_non_null_) {
    uVar4 = (ulong)b_local;
    while ((uVar4 < (this->super_UntypedMapBase).num_buckets_ &&
           ((this->super_UntypedMapBase).table_[uVar4] == 0))) {
      uVar4 = uVar4 + 1;
      (this->super_UntypedMapBase).index_of_first_non_null_ = (map_index_t)uVar4;
    }
  }
  return;
}

Assistant:

PROTOBUF_NOINLINE void erase_no_destroy(map_index_t b, KeyNode* node) {
    TreeIterator tree_it;
    const bool is_list = revalidate_if_necessary(b, node, &tree_it);
    if (is_list) {
      ABSL_DCHECK(TableEntryIsNonEmptyList(b));
      auto* head = TableEntryToNode(table_[b]);
      head = EraseFromLinkedList(node, head);
      table_[b] = NodeToTableEntry(head);
    } else {
      EraseFromTree(b, tree_it);
    }
    --num_elements_;
    if (PROTOBUF_PREDICT_FALSE(b == index_of_first_non_null_)) {
      while (index_of_first_non_null_ < num_buckets_ &&
             TableEntryIsEmpty(index_of_first_non_null_)) {
        ++index_of_first_non_null_;
      }
    }
  }